

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGeneratedFileStream.cxx
# Opt level: O2

int testGeneratedFileStream(int param_1,char **param_2)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> local_3b9;
  string local_3b8;
  string file4;
  string file3;
  string file2;
  string file1;
  string file4tmp;
  string file3tmp;
  string file1tmp;
  string file2tmp;
  cmGeneratedFileStream gm;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&gm,None);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file1,"generatedFile1",(allocator<char> *)&file2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file2,"generatedFile2",(allocator<char> *)&file3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file3,"generatedFile3",(allocator<char> *)&file4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&file4,"generatedFile4",(allocator<char> *)&file1tmp);
  __lhs = &file1;
  std::operator+(&file1tmp,__lhs,".tmp");
  std::operator+(&file2tmp,&file2,".tmp");
  std::operator+(&file3tmp,&file3,".tmp");
  std::operator+(&file4tmp,&file4,".tmp");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,file1._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&gm,&local_3b8,false,false);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::operator<<((ostream *)&gm,"This is generated file 1");
  cmGeneratedFileStream::Close(&gm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,file2._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&gm,&local_3b8,false,false);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::operator<<((ostream *)&gm,"This is generated file 2");
  cmGeneratedFileStream::Close(&gm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,file3._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&gm,&local_3b8,false,false);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::operator<<((ostream *)&gm,"This is generated file 3");
  cmGeneratedFileStream::Close(&gm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,file4._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&gm,&local_3b8,false,false);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::operator<<((ostream *)&gm,"This is generated file 4");
  cmGeneratedFileStream::Close(&gm);
  bVar1 = cmsys::SystemTools::FileExists(file1._M_dataplus._M_p);
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FileExists(file2._M_dataplus._M_p);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileExists(file3._M_dataplus._M_p);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileExists(file4._M_dataplus._M_p);
        if (bVar1) {
          bVar1 = cmsys::SystemTools::FileExists(file1tmp._M_dataplus._M_p);
          if (bVar1) {
            poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
            poVar2 = std::operator<<(poVar2,
                                     "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                    );
            __lhs = &file1tmp;
          }
          else {
            bVar1 = cmsys::SystemTools::FileExists(file2tmp._M_dataplus._M_p);
            if (bVar1) {
              poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
              poVar2 = std::operator<<(poVar2,
                                       "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                      );
              __lhs = &file2tmp;
            }
            else {
              bVar1 = cmsys::SystemTools::FileExists(file3tmp._M_dataplus._M_p);
              if (bVar1) {
                poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                poVar2 = std::operator<<(poVar2,
                                         "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                        );
                __lhs = &file3tmp;
              }
              else {
                bVar1 = cmsys::SystemTools::FileExists(file4tmp._M_dataplus._M_p);
                if (!bVar1) {
                  iVar3 = 0;
                  std::operator<<((ostream *)&std::cout,"cmGeneratedFileStream works\n");
                  goto LAB_00166470;
                }
                poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                poVar2 = std::operator<<(poVar2,
                                         "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                        );
                __lhs = &file4tmp;
              }
            }
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
          poVar2 = std::operator<<(poVar2,
                                   "Something wrong with cmGeneratedFileStream. Cannot find file: ")
          ;
          __lhs = &file4;
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
        poVar2 = std::operator<<(poVar2,"Something wrong with cmGeneratedFileStream. Found file: ");
        __lhs = &file3;
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
      poVar2 = std::operator<<(poVar2,
                               "Something wrong with cmGeneratedFileStream. Cannot find file: ");
      __lhs = &file2;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"Something wrong with cmGeneratedFileStream. Cannot find file: "
                            );
  }
  poVar2 = std::operator<<(poVar2,(__lhs->_M_dataplus)._M_p);
  std::operator<<(poVar2,"\n");
  iVar3 = 1;
LAB_00166470:
  cmsys::SystemTools::RemoveFile(&file1);
  cmsys::SystemTools::RemoveFile(&file2);
  cmsys::SystemTools::RemoveFile(&file3);
  cmsys::SystemTools::RemoveFile(&file4);
  cmsys::SystemTools::RemoveFile(&file1tmp);
  cmsys::SystemTools::RemoveFile(&file2tmp);
  cmsys::SystemTools::RemoveFile(&file3tmp);
  cmsys::SystemTools::RemoveFile(&file4tmp);
  std::__cxx11::string::~string((string *)&file4tmp);
  std::__cxx11::string::~string((string *)&file3tmp);
  std::__cxx11::string::~string((string *)&file2tmp);
  std::__cxx11::string::~string((string *)&file1tmp);
  std::__cxx11::string::~string((string *)&file4);
  std::__cxx11::string::~string((string *)&file3);
  std::__cxx11::string::~string((string *)&file2);
  std::__cxx11::string::~string((string *)&file1);
  cmGeneratedFileStream::~cmGeneratedFileStream(&gm);
  return iVar3;
}

Assistant:

int testGeneratedFileStream(int /*unused*/, char* /*unused*/ [])
{
  int failed = 0;
  cmGeneratedFileStream gm;
  std::string file1 = "generatedFile1";
  std::string file2 = "generatedFile2";
  std::string file3 = "generatedFile3";
  std::string file4 = "generatedFile4";
  std::string file1tmp = file1 + ".tmp";
  std::string file2tmp = file2 + ".tmp";
  std::string file3tmp = file3 + ".tmp";
  std::string file4tmp = file4 + ".tmp";
  gm.Open(file1.c_str());
  gm << "This is generated file 1";
  gm.Close();
  gm.Open(file2.c_str());
  gm << "This is generated file 2";
  gm.Close();
  gm.Open(file3.c_str());
  gm << "This is generated file 3";
  gm.Close();
  gm.Open(file4.c_str());
  gm << "This is generated file 4";
  gm.Close();
  if (cmSystemTools::FileExists(file1.c_str())) {
    if (cmSystemTools::FileExists(file2.c_str())) {
      if (cmSystemTools::FileExists(file3.c_str())) {
        if (cmSystemTools::FileExists(file4.c_str())) {
          if (cmSystemTools::FileExists(file1tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file1tmp.c_str());
          } else if (cmSystemTools::FileExists(file2tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file2tmp.c_str());
          } else if (cmSystemTools::FileExists(file3tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file3tmp.c_str());
          } else if (cmSystemTools::FileExists(file4tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file4tmp.c_str());
          } else {
            std::cout << "cmGeneratedFileStream works\n";
          }
        } else {
          cmFailed(
            "Something wrong with cmGeneratedFileStream. Cannot find file: ",
            file4.c_str());
        }
      } else {
        cmFailed("Something wrong with cmGeneratedFileStream. Found file: ",
                 file3.c_str());
      }
    } else {
      cmFailed(
        "Something wrong with cmGeneratedFileStream. Cannot find file: ",
        file2.c_str());
    }
  } else {
    cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ",
             file1.c_str());
  }
  cmSystemTools::RemoveFile(file1);
  cmSystemTools::RemoveFile(file2);
  cmSystemTools::RemoveFile(file3);
  cmSystemTools::RemoveFile(file4);
  cmSystemTools::RemoveFile(file1tmp);
  cmSystemTools::RemoveFile(file2tmp);
  cmSystemTools::RemoveFile(file3tmp);
  cmSystemTools::RemoveFile(file4tmp);

  return failed;
}